

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O0

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitIf(SubtypingDiscoverer<NullFixer> *this,If *curr)

{
  NullFixer *pNVar1;
  bool local_1d;
  BasicType local_1c;
  If *local_18;
  If *curr_local;
  SubtypingDiscoverer<NullFixer> *this_local;
  
  local_1d = false;
  local_18 = curr;
  curr_local = (If *)this;
  if (curr->ifFalse != (Expression *)0x0) {
    local_1c = unreachable;
    local_1d = wasm::Type::operator!=
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)2>).
                           super_Expression.type,&local_1c);
  }
  if (local_1d != false) {
    pNVar1 = self(this);
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
    Expression__(pNVar1,local_18->ifTrue,(Expression *)local_18);
    pNVar1 = self(this);
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
    Expression__(pNVar1,local_18->ifFalse,(Expression *)local_18);
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (curr->ifFalse && curr->type != Type::unreachable) {
      self()->noteSubtype(curr->ifTrue, curr);
      self()->noteSubtype(curr->ifFalse, curr);
    }
  }